

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_subtract.c
# Opt level: O3

void add_subtract(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  uint uVar2;
  status_register_t *psVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  uVar1 = thminstr->raw;
  uVar2 = *(uint *)((long)state->r + (ulong)(uVar1 >> 1 & 0x1c));
  if ((uVar1 >> 9 & 1) == 0) {
    if ((uVar1 >> 10 & 1) == 0) {
      lVar5 = (ulong)state->r[uVar1 >> 6 & 7] + (ulong)uVar2;
      (state->cpsr).raw =
           (~(state->r[uVar1 >> 6 & 7] ^ uVar2) & ((uint)lVar5 ^ uVar2)) >> 3 & 0x10000000 |
           (state->cpsr).raw & 0xcfffffff | (int)((ulong)lVar5 >> 0x20) << 0x1d;
      uVar6 = *(uint *)((long)state->r + (ulong)(thminstr->raw >> 4 & 0x1c));
    }
    else {
      lVar5 = (ulong)(uVar1 >> 6 & 7) + (ulong)uVar2;
      (state->cpsr).raw =
           ((uint)lVar5 & ~uVar2) >> 3 & 0x30000000 | (int)((ulong)lVar5 >> 0x20) << 0x1d |
           (state->cpsr).raw & 0xcfffffff;
      uVar6 = (uint)*thminstr >> 6 & 7;
    }
    uVar6 = uVar6 + uVar2;
  }
  else {
    uVar4 = uVar1 >> 6 & 7;
    if ((uVar1 >> 10 & 1) == 0) {
      uVar4 = state->r[uVar4];
      uVar6 = uVar2 - uVar4;
      (state->cpsr).raw =
           (~(uVar4 ^ uVar6) & (uVar4 ^ uVar2)) >> 3 & 0x10000000 |
           (state->cpsr).raw & 0xcfffffff | (uint)(uVar4 <= uVar2) << 0x1d;
    }
    else {
      uVar6 = uVar2 - uVar4;
      (state->cpsr).raw =
           ((~uVar6 & uVar2) >> 3 | (uint)(byte)~(uVar2 < uVar4) << 0x1d) & 0x30000000 |
           (state->cpsr).raw & 0xcfffffff;
    }
  }
  psVar3 = get_psr(state);
  psVar3->raw = uVar6 & 0x80000000 | (uint)(uVar6 == 0) << 0x1e | psVar3->raw & 0x3fffffff;
  uVar1 = thminstr->raw;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)(uVar1 & 7),(ulong)uVar6);
  }
  state->r[uVar1 & 7] = uVar6;
  return;
}

Assistant:

void add_subtract(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    add_subtract_t* instr = &thminstr->ADD_SUBTRACT;
    word newvalue = get_register(state, instr->rs);
    if (instr->op) { // subtract
        word result = newvalue;
        if (instr->i) {
            result -= instr->rn_or_offset;
            set_flags_sub(state, newvalue, instr->rn_or_offset, result);
        } else {
            word rndata = get_register(state, instr->rn_or_offset);
            result -= rndata;
            set_flags_sub(state, newvalue, rndata, result);
        }
        newvalue = result;
    } else { // add
        if (instr->i) {
            set_flags_add(state, newvalue, instr->rn_or_offset);
            newvalue += instr->rn_or_offset;
        } else {
            word rndata = get_register(state, instr->rn_or_offset);
            set_flags_add(state, newvalue, rndata);
            newvalue += get_register(state, instr->rn_or_offset);
        }
    }

    set_flags_nz(state, newvalue);
    set_register(state, instr->rd, newvalue);
}